

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

void __thiscall jpgd::jpeg_decoder::create_look_ups(jpeg_decoder *this)

{
  int iVar1;
  int local_14;
  int k;
  int i;
  jpeg_decoder *this_local;
  
  for (local_14 = 0; local_14 < 0x100; local_14 = local_14 + 1) {
    iVar1 = local_14 + -0x80;
    this->m_crr[local_14] = iVar1 * 0x166e9 + 0x8000 >> 0x10;
    this->m_cbb[local_14] = iVar1 * 0x1c5a2 + 0x8000 >> 0x10;
    this->m_crg[local_14] = iVar1 * -0xb6d2;
    this->m_cbg[local_14] = iVar1 * -0x581a + 0x8000;
  }
  return;
}

Assistant:

void jpeg_decoder::create_look_ups()
	{
		for (int i = 0; i <= 255; i++)
		{
			int k = i - 128;
			m_crr[i] = (FIX(1.40200f) * k + ONE_HALF) >> SCALEBITS;
			m_cbb[i] = (FIX(1.77200f) * k + ONE_HALF) >> SCALEBITS;
			m_crg[i] = (-FIX(0.71414f)) * k;
			m_cbg[i] = (-FIX(0.34414f)) * k + ONE_HALF;
		}
	}